

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

bool __thiscall
cmState::AddScriptedCommand
          (cmState *this,string *name,
          BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
          *command,cmMakefile *mf)

{
  bool bVar1;
  size_type sVar2;
  cmake *this_00;
  mapped_type *pmVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  Command oldCmd;
  string local_80;
  undefined1 local_50 [8];
  string sName;
  cmMakefile *mf_local;
  BT<std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>
  *command_local;
  string *name_local;
  cmState *this_local;
  
  sName.field_2._8_8_ = mf;
  cmsys::SystemTools::LowerCase((string *)local_50,name);
  sVar2 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->FlowControlCommands,(string *)local_50);
  if (sVar2 == 0) {
    GetCommandByExactName((Command *)local_a8,this,(string *)local_50);
    bVar1 = std::function::operator_cast_to_bool((function *)local_a8);
    if (bVar1) {
      std::operator+(&local_c8,"_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      pmVar3 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>_>
               ::operator[](&this->ScriptedCommands,&local_c8);
      std::
      function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
      ::operator=(pmVar3,(function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                          *)local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::
    function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
    ::~function((function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                 *)local_a8);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>_>
             ::operator[](&this->ScriptedCommands,(key_type *)local_50);
    std::
    function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
    ::operator=(pmVar3,&command->Value);
    this_local._7_1_ = true;
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance((cmMakefile *)sName.field_2._8_8_);
    cmStrCat<char_const(&)[32],std::__cxx11::string&,char_const(&)[24]>
              (&local_80,(char (*) [32])"Built-in flow control command \"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (char (*) [24])"\" cannot be overridden.");
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_80,&command->Backtrace);
    std::__cxx11::string::~string((string *)&local_80);
    cmSystemTools::SetFatalErrorOccurred();
    this_local._7_1_ = false;
  }
  oldCmd._M_invoker._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool cmState::AddScriptedCommand(std::string const& name, BT<Command> command,
                                 cmMakefile& mf)
{
  std::string sName = cmSystemTools::LowerCase(name);

  if (this->FlowControlCommands.count(sName)) {
    mf.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Built-in flow control command \"", sName,
               "\" cannot be overridden."),
      command.Backtrace);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // if the command already exists, give a new name to the old command.
  if (Command oldCmd = this->GetCommandByExactName(sName)) {
    this->ScriptedCommands["_" + sName] = oldCmd;
  }

  this->ScriptedCommands[sName] = std::move(command.Value);
  return true;
}